

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

int __thiscall
TPZBlockDiagonal<double>::PutVal
          (TPZBlockDiagonal<double> *this,int64_t row,int64_t col,double *value)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar2 = (this->fBlockSize).fNElements;
  if (lVar2 == 0) {
    pcVar5 = "TPZBlockDiagonal::PutVal called with parameters out of range\n";
  }
  else {
    lVar3 = 0;
    lVar8 = 0;
    do {
      lVar7 = lVar8;
      lVar6 = lVar3;
      lVar4 = (long)(this->fBlockSize).fStore[lVar6];
      lVar8 = lVar7 + lVar4;
      if (lVar2 <= lVar6) break;
      lVar3 = lVar6 + 1;
    } while (lVar8 <= row);
    if (lVar2 + 1 != lVar6 + 1) {
      dVar1 = *value;
      if (col < lVar7 || lVar8 <= col) {
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          pcVar5 = "TPZBlockDiagonal::PutVal, indices row col out of range\n";
          goto LAB_00c942c0;
        }
      }
      else {
        (this->fStorage).fStore
        [(row - lVar7) + (this->fBlockPos).fStore[lVar6] + (col - lVar7) * lVar4] = dVar1;
      }
      return 0;
    }
    pcVar5 = "TPZBlockDiagonal::PutVal wrong data structure\n";
  }
LAB_00c942c0:
  std::operator<<((ostream *)&std::cout,pcVar5);
  return -1;
}

Assistant:

TPZBlockDiagonal<TVar>::~TPZBlockDiagonal ()
{
}